

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::predict
          (FastText *this,istream *in,int32_t k,
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *predictions)

{
  int32_t iVar1;
  pointer __x;
  vector<int,_std::allocator<int>_> words;
  Vector output;
  Vector hidden;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> modelPredictions;
  vector<int,_std::allocator<int>_> labels;
  _Vector_base<int,_std::allocator<int>_> local_f8;
  Vector local_d8;
  Vector local_c8;
  _Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_b8;
  _Vector_base<int,_std::allocator<int>_> local_98;
  string local_78;
  undefined1 local_58 [40];
  
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Dictionary::getLine((this->dict_).
                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in
                      ,(vector<int,_std::allocator<int>_> *)&local_f8,
                      (vector<int,_std::allocator<int>_> *)&local_98,
                      &((this->model_).
                        super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->rng
                     );
  Dictionary::addNgrams
            ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(vector<int,_std::allocator<int>_> *)&local_f8,
             ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             wordNgrams);
  if (local_f8._M_impl.super__Vector_impl_data._M_start !=
      local_f8._M_impl.super__Vector_impl_data._M_finish) {
    Vector::Vector(&local_c8,
                   (long)((this->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         dim);
    iVar1 = Dictionary::nlabels((this->dict_).
                                super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
    Vector::Vector(&local_d8,(long)iVar1);
    local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Model::predict((this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(vector<int,_std::allocator<int>_> *)&local_f8,k,
                   (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   &local_b8,&local_c8,&local_d8);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(predictions);
    for (__x = local_b8._M_impl.super__Vector_impl_data._M_start;
        __x != local_b8._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
      Dictionary::getLabel_abi_cxx11_
                (&local_78,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,__x->second);
      std::
      pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_58,&__x->first,&local_78);
      std::
      vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
      ::emplace_back<std::pair<float,std::__cxx11::string>>
                ((vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
                  *)predictions,
                 (pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~_Vector_base
              (&local_b8);
    Vector::~Vector(&local_d8);
    Vector::~Vector(&local_c8);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f8);
  return;
}

Assistant:

void FastText::predict(std::istream& in, int32_t k,
                       std::vector<std::pair<real,std::string>>& predictions) const {
  std::vector<int32_t> words, labels;
  dict_->getLine(in, words, labels, model_->rng);
  dict_->addNgrams(words, args_->wordNgrams);
  if (words.empty()) return;
  Vector hidden(args_->dim);
  Vector output(dict_->nlabels());
  std::vector<std::pair<real,int32_t>> modelPredictions;
  model_->predict(words, k, modelPredictions, hidden, output);
  predictions.clear();
  for (auto it = modelPredictions.cbegin(); it != modelPredictions.cend(); it++) {
    predictions.push_back(std::make_pair(it->first, dict_->getLabel(it->second)));
  }
}